

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLZWDecodeStream.cpp
# Opt level: O3

int __thiscall InputLZWDecodeStream::GetCode(InputLZWDecodeStream *this)

{
  undefined8 in_RAX;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Byte buffer;
  undefined8 uStack_18;
  
  iVar2 = this->inputBits;
  iVar3 = this->nextBits;
  if (iVar2 < iVar3) {
    uStack_18 = in_RAX;
    do {
      (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,(long)&uStack_18 + 7,1);
      uVar4 = this->inputBuf << 8 | (uint)uStack_18._7_1_;
      this->inputBuf = uVar4;
      iVar2 = this->inputBits + 8;
      this->inputBits = iVar2;
      iVar3 = this->nextBits;
    } while (iVar2 < iVar3);
  }
  else {
    uVar4 = this->inputBuf;
  }
  bVar1 = (byte)(iVar2 - iVar3);
  this->inputBits = iVar2 - iVar3;
  this->inputBuf = ~(-1 << (bVar1 & 0x1f)) & uVar4;
  return ~(-1 << ((byte)iVar3 & 0x1f)) & (int)uVar4 >> (bVar1 & 0x1f);
}

Assistant:

int InputLZWDecodeStream::GetCode() {
	int c;
	int code;

	IOBasicTypes::Byte buffer;
	while (inputBits < nextBits) 
	{
		mSourceStream->Read(&buffer, 1);
		c = buffer;

		if (c == -1) return -1;
		inputBuf = (inputBuf << 8) | (c & 0xff);
		inputBits += 8;
	}
	code = (inputBuf >> (inputBits - nextBits)) & ((1 << nextBits) - 1);
	inputBits -= nextBits;
	inputBuf = inputBuf & ((1 << inputBits) - 1); // avoid overflow by limiting to the bits its supposed to use 
	return code;
}